

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::evalTexture2DOffsetBias(ShaderEvalContext *c,TexLookupParams *p)

{
  Texture2D *pTVar1;
  int i;
  long lVar2;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  undefined8 local_48;
  ulong uStack_40;
  float local_38 [6];
  
  local_48 = *(undefined8 *)(p->offset).m_data;
  pTVar1 = c->textures[0].tex2D;
  uStack_40 = uStack_40 & 0xffffffff00000000;
  tcu::sampleLevelArray2DOffset
            ((ConstPixelBufferAccess *)&stack0xffffffffffffffe0,(int)(pTVar1->m_view).m_levels,
             (Sampler *)(ulong)(uint)(pTVar1->m_view).m_numLevels,c->in[0].m_data[0],
             c->in[0].m_data[1],p->lod + c->in[1].m_data[0],(IVec3 *)c->textures);
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  lVar2 = 0;
  do {
    local_38[lVar2] = *(float *)(&stack0xffffffffffffffe0 + lVar2 * 4) * (p->scale).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_38[lVar2] + (p->bias).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  *(undefined8 *)(c->color).m_data = local_48;
  *(ulong *)((c->color).m_data + 2) = uStack_40;
  return;
}

Assistant:

static void		evalTexture2DOffsetBias			(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture2DOffset(c, c.in[0].x(), c.in[0].y(), p.lod+c.in[1].x(), p.offset.swizzle(0,1))*p.scale + p.bias; }